

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setWindowRole(QWidget *this,QString *role)

{
  QWidgetPrivate *this_00;
  long *plVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  QWidgetPrivate::createTLExtra(this_00);
  QString::operator=((QString *)
                     ((long)(((this_00->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                            super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x58
                     ),(QString *)role);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(lVar2 + 8);
  }
  if ((lVar2 != 0) && (*(long *)(lVar2 + 0x20) != 0)) {
    auVar3 = QWindow::handle();
    if (auVar3._0_8_ == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar3._8_8_;
      auVar4 = auVar4 << 0x40;
    }
    else {
      auVar4 = __dynamic_cast(auVar3._0_8_,&QPlatformWindow::typeinfo,
                              &QNativeInterface::Private::QXcbWindow::typeinfo,0xfffffffffffffffe);
    }
    plVar1 = auVar4._0_8_;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))(plVar1,role,auVar4._8_8_,*(code **)(*plVar1 + 0x18));
      return;
    }
  }
  return;
}

Assistant:

void QWidget::setWindowRole(const QString &role)
{
#if QT_CONFIG(xcb)
    Q_D(QWidget);
    d->createTLExtra();
    d->topData()->role = role;
    if (windowHandle()) {
        if (auto *xcbWindow = dynamic_cast<QXcbWindow*>(windowHandle()->handle()))
            xcbWindow->setWindowRole(role);
    }
#else
    Q_UNUSED(role);
#endif
}